

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_world.cpp
# Opt level: O0

void __thiscall RandomizerWorld::load_regions(RandomizerWorld *this)

{
  bool bVar1;
  WorldRegion *pWVar2;
  LandstalkerException *this_00;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  type *local_d8;
  type *node;
  type *id;
  _Self local_c0;
  iterator __end1_1;
  iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
  *__range1_1;
  reference local_a0;
  Json *region_json;
  iterator __end1;
  iterator __begin1;
  Json *__range1;
  function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  local_40;
  undefined1 local_20 [8];
  Json regions_json;
  RandomizerWorld *this_local;
  
  regions_json.m_value = (json_value)this;
  std::
  function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  ::function(&local_40,(nullptr_t)0x0);
  nlohmann::
  basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<unsigned_char_const(&)[8279]>
            ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)local_20,
             (uchar (*) [8279])
             "[\n    {\n        \"name\": \"Massan\",\n        \"hintName\": \"in the village of Massan\",\n        \"nodeIds\": [\n            \"massan\",\n            \"massan_after_swamp_shrine\"\n        ]\n    },\n    {\n        \"name\": \"Massan Cave\",\n        \"hintName\": \"in the cave near Massan\",\n        \"nodeIds\": [\n            \"massan_cave\"\n        ],\n        \"darkMapIds\": [\n            803, 804, 805, 806, 807\n        ]\n    },\n    {\n        \"name\": \"Route between Massan and Gumi\",\n        \"canBeHintedAsRequired\": false,\n        \"nodeIds\": [\n            \"route_massan_gumi\"\n        ]\n    },\n    {\n        \"name\": \"Waterfall Shrine\",\n        \"hintName\": \"in the waterfall shrine\",\n        \"nodeIds\": [\n            \"waterfall_shrine\"\n        ],\n        \"darkMapIds\": [\n            174, 175, 176, 177, 178, 179, 180, 181, 182\n        ]\n    },\n    {\n        \"name\": \"Swamp Shrine\",\n        \"hintName\": \"in the swamp shrine\",\n        \"canBeHintedAsRequired\": false,\n        \"nodeIds\": [\n            \"swamp_shrine\"\n        ],\n        \"darkMapIds\": [\n            0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 12, 13, 15, 16, 17, 18, 19, 20, 21, 22, 23, 24, 25, 27, 30\n        ]\n    },\n    {\n        \"name\": \"Gumi\",\n        \"hintName\": \"in the village of Gumi\",\n        \"nodeIds\": [\n            \"gumi\",\n            \"gumi_after_swamp_shrine\"\n        ]\n    },\n    {\n        \"name\": \"Route between Gumi and Ryuma\",\n        \"canBeHintedAsRequired\": false,\n        \"nodeIds\": [\n            \"route_gumi_ryuma\"\n        ]\n    },\n    {\n        \"name\": \"Tibor\",\n        \"hintName\": \"inside Tibor\",\n        \"nodeIds\": [\n            \"tibor\"\n        ],\n        \"darkMapIds\": [\n            808, 809, 810, 811, 812, 813, 814, 815\n        ]\n    },\n    {\n        \"name\": \"Ryuma\",\n        \"hintName\": \"in the town of Ryuma\",\n        \"nodeIds\": [\n            \"ryuma\",\n            \"ryuma_after_thieves_hideout\",\n            \"ryuma_lighthouse_repaired\"\n        ]\n    },\n    {\n        \"name\": \"Thieves Hideout\",\n        \"hintName\": \"in the thieves\' hideout\",\n        \"nodeIds\": [\n            \"thieves_hideout_pre_key\",\n..." /* TRUNCATED STRING LITERAL */
             ,&local_40,true,false);
  std::
  function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  ::~function(&local_40);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::begin((iterator *)&__end1.m_it.primitive_iterator,
          (basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           *)local_20);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::end((iterator *)&region_json,
        (basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
         *)local_20);
  while( true ) {
    bVar1 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      ((iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&__end1.m_it.primitive_iterator,
                       (iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&region_json);
    if (!bVar1) break;
    local_a0 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*((iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)&__end1.m_it.primitive_iterator);
    __range1_1 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
                  *)WorldRegion::from_json(local_a0,&this->_nodes);
    std::vector<WorldRegion*,std::allocator<WorldRegion*>>::emplace_back<WorldRegion*>
              ((vector<WorldRegion*,std::allocator<WorldRegion*>> *)&this->_regions,
               (WorldRegion **)&__range1_1);
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++((iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&__end1.m_it.primitive_iterator);
  }
  __end1_1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
             ::begin(&this->_nodes);
  local_c0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
       ::end(&this->_nodes);
  while( true ) {
    bVar1 = std::operator==(&__end1_1,&local_c0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      nlohmann::
      basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_20);
      return;
    }
    id = &std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>
          ::operator*(&__end1_1)->first;
    node = (type *)std::get<0ul,std::__cxx11::string_const,WorldNode*>
                             ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>
                               *)id);
    local_d8 = std::get<1ul,std::__cxx11::string_const,WorldNode*>
                         ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>
                           *)id);
    pWVar2 = WorldNode::region(*local_d8);
    if (pWVar2 == (WorldRegion *)0x0) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>
    ::operator++(&__end1_1);
  }
  this_00 = (LandstalkerException *)__cxa_allocate_exception(0x28);
  __rhs = WorldNode::id_abi_cxx11_(*local_d8);
  std::operator+(&local_118,"Node \'",__rhs);
  std::operator+(&local_f8,&local_118,"\' doesn\'t belong to any region");
  LandstalkerException::LandstalkerException(this_00,&local_f8);
  __cxa_throw(this_00,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException);
}

Assistant:

void RandomizerWorld::load_regions()
{
    Json regions_json = Json::parse(WORLD_REGIONS_JSON);
    for(const Json& region_json : regions_json)
        _regions.emplace_back(WorldRegion::from_json(region_json, _nodes));

    for(auto& [id, node] : _nodes)
        if(node->region() == nullptr)
            throw LandstalkerException("Node '" + node->id() + "' doesn't belong to any region");
}